

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_compare_Test::~Test_aistr_compare_Test(Test_aistr_compare_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(Test_aistr, compare) {
    char buf[10] = {0};

    EXPECT_THROW(ai::compare(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);
    ASSERT_NE(ai::compare(buf, "1234 "), 0);
    ASSERT_NE(ai::compare(buf, " 1234"), 0);
    ASSERT_EQ(ai::compare(buf, "1234\0"), 0);

    ai::assign(buf, "");
    ASSERT_EQ(ai::compare(buf, ""), 0);

    ai::assign(buf, "123456789");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::assign(buf, "12345678901");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}